

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_cvttpd2dq_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint32_t uVar1;
  
  uVar1 = x86_float64_to_int32_round_to_zero(s->_d_ZMMReg[0],&env->sse_status);
  d->_l_ZMMReg[0] = uVar1;
  uVar1 = x86_float64_to_int32_round_to_zero(s->_d_ZMMReg[1],&env->sse_status);
  d->_l_ZMMReg[1] = uVar1;
  d->_q_ZMMReg[1] = 0;
  return;
}

Assistant:

void helper_cvttpd2dq(CPUX86State *env, ZMMReg *d, ZMMReg *s)
{
    d->ZMM_L(0) = x86_float64_to_int32_round_to_zero(s->ZMM_D(0), &env->sse_status);
    d->ZMM_L(1) = x86_float64_to_int32_round_to_zero(s->ZMM_D(1), &env->sse_status);
    d->ZMM_Q(1) = 0;
}